

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.cpp
# Opt level: O1

Collision * __thiscall
Plane::collide(Collision *__return_storage_ptr__,Plane *this,Vector3 *start,Vector3 *dir)

{
  Vector3 *this_00;
  double dVar1;
  double dVar2;
  Vector3 local_48;
  
  this_00 = &this->m_n;
  dVar1 = Vector3::dot(this_00,start);
  dVar1 = dVar1 + this->m_d;
  dVar2 = Vector3::dot(this_00,dir);
  if ((ABS(dVar2) < 1e-06) || (-dVar1 / dVar2 < 1e-06)) {
    Collision::Collision(__return_storage_ptr__);
  }
  else {
    if (dVar1 <= 1e-06) {
      Vector3::operator-(this_00);
      this_00 = &local_48;
    }
    Collision::Collision
              (__return_storage_ptr__,start,dir,-dVar1 / dVar2,this_00,dVar1 <= 1e-06,
               &this->super_Object);
  }
  return __return_storage_ptr__;
}

Assistant:

Collision Plane::collide(const Vector3& start, const Vector3& dir) const
{
    double n = m_n.dot(start) + m_d, d = m_n.dot(dir);
    if (abs(d) < Const::EPS) return Collision();
    double t = -n / d;
    if (t < Const::EPS) return Collision();
    if (n > Const::EPS)
        return Collision(start, dir, t, m_n, false, this);
    else
        return Collision(start, dir, t, -m_n, true, this);
}